

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaConfig.h
# Opt level: O0

void __thiscall xmrig::CudaConfig::CudaConfig(CudaConfig *this)

{
  undefined1 *in_RDI;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x22e2f3);
  String::String((String *)(in_RDI + 0x20));
  Threads<xmrig::CudaThreads>::Threads((Threads<xmrig::CudaThreads> *)0x22e30f);
  *(undefined4 *)(in_RDI + 0x60) = 0;
  *(undefined4 *)(in_RDI + 100) = 0;
  in_RDI[0x68] = 1;
  String::String((String *)(in_RDI + 0x70));
  return;
}

Assistant:

CudaConfig() = default;